

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_6fc9f::MpPlugIn::reset(MpPlugIn *this)

{
  MpWanderer *this_00;
  MpBase **ppMVar1;
  undefined8 extraout_XMM0_Qa;
  float fVar2;
  
  this_00 = this->wanderer;
  MpBase::reset(&this_00->super_MpBase);
  fVar2 = 0.6;
  OpenSteer::Color::set
            ((Color *)&(this_00->super_MpBase).super_SimpleVehicle.field_0xe4,0.4,0.6,0.4,1.0);
  ppMVar1 = (this->pBegin)._M_current;
  if ((this->pEnd)._M_current != ppMVar1) {
    do {
      MpPursuer::reset((MpPursuer *)*ppMVar1);
      ppMVar1 = ppMVar1 + 1;
    } while (ppMVar1 != (this->pEnd)._M_current);
  }
  OpenSteer::OpenSteerDemo::camera.smoothNextMove = false;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._forward.x = 0.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._forward.y = 0.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._forward.z = 1.0;
  (*OpenSteer::OpenSteerDemo::camera.super_LocalSpace.super_AbstractLocalSpace.
    _vptr_AbstractLocalSpace[0x14])(&OpenSteer::OpenSteerDemo::camera,0x17aa20);
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._side.x = (float)extraout_XMM0_Qa;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._side.y = SUB84(extraout_XMM0_Qa,4);
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._side.z = fVar2;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._up.x = 0.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._up.y = 1.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._up.z = 0.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.x = 0.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.y = 0.0;
  OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.z = 0.0;
  return;
}

Assistant:

void reset (void)
        {
            // reset wanderer and pursuers
            wanderer->reset ();
            for (iterator i = pBegin; i != pEnd; i++) ((MpPursuer&)(**i)).reset ();

            // immediately jump to default camera position
            OpenSteerDemo::camera.doNotSmoothNextMove ();
            OpenSteerDemo::camera.resetLocalSpace ();
        }